

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_gif * rf_load_animated_gif
                   (rf_gif *__return_storage_ptr__,void *data,rf_int data_size,
                   rf_allocator allocator,rf_allocator temp_allocator)

{
  int iVar1;
  int iVar2;
  long lVar3;
  rf_source_location rVar4;
  rf_allocator_args rVar5;
  int iVar6;
  stbi_uc *__src;
  void *__dest;
  long *in_FS_OFFSET;
  rf_gif *gif;
  uint uStack_94;
  void *dst;
  int loaded_gif_size;
  void *loaded_gif;
  rf_int rStack_28;
  int component_count;
  rf_int data_size_local;
  void *data_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  data_local = allocator.user_data;
  rStack_28 = data_size;
  data_size_local = (rf_int)data;
  memset(__return_storage_ptr__,0,0x28);
  lVar3 = *in_FS_OFFSET;
  *(void **)(lVar3 + -0x440) = temp_allocator.user_data;
  *(rf_allocator_proc **)(lVar3 + -0x438) = temp_allocator.allocator_proc;
  loaded_gif._4_4_ = 0;
  __src = stbi_load_gif_from_memory
                    ((stbi_uc *)data_size_local,(int)rStack_28,&__return_storage_ptr__->frame_delays
                     ,&(__return_storage_ptr__->field_2).image.width,
                     &(__return_storage_ptr__->field_2).image.height,
                     &__return_storage_ptr__->frames_count,(int *)((long)&loaded_gif + 4),4);
  if ((__src != (stbi_uc *)0x0) && (loaded_gif._4_4_ == 4)) {
    iVar1 = (__return_storage_ptr__->field_2).image.width;
    iVar2 = (__return_storage_ptr__->field_2).image.height;
    iVar6 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    __dest = (void *)(*(code *)allocator_local.user_data)(&data_local,1);
    if (__dest != (void *)0x0) {
      memcpy(__dest,__src,(long)(iVar1 * iVar2 * iVar6));
      (__return_storage_ptr__->field_2).image.data = __dest;
      (__return_storage_ptr__->field_2).image.format = RF_UNCOMPRESSED_R8G8B8A8;
      (__return_storage_ptr__->field_2).image.valid = true;
    }
  }
  rVar4.proc_name._0_4_ = 0x1b2f73;
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.proc_name._4_4_ = 0;
  rVar4.line_in_file = 0x46a1;
  rVar5.size_to_allocate_or_reallocate = 0;
  rVar5.pointer_to_free_or_realloc = __src;
  rVar5._16_8_ = (ulong)uStack_94 << 0x20;
  (*temp_allocator.allocator_proc)(&temp_allocator,rVar4,RF_AM_FREE,rVar5);
  lVar3 = *in_FS_OFFSET;
  *(undefined8 *)(lVar3 + -0x440) = 0;
  *(undefined8 *)(lVar3 + -0x438) = 0;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_gif rf_load_animated_gif(const void* data, rf_int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_gif gif = {0};

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        int component_count = 0;
        void* loaded_gif = stbi_load_gif_from_memory(data, data_size, &gif.frame_delays, &gif.width, &gif.height, &gif.frames_count, &component_count, 4);

        if (loaded_gif && component_count == 4)
        {
            int loaded_gif_size = gif.width * gif.height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
            void* dst = RF_ALLOC(allocator, loaded_gif_size);

            if (dst)
            {
                memcpy(dst, loaded_gif, loaded_gif_size);

                gif.data   = dst;
                gif.format = RF_UNCOMPRESSED_R8G8B8A8;
                gif.valid  = true;
            }
        }

        RF_FREE(temp_allocator, loaded_gif);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    return gif;
}